

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_ptr get_fpstatus_ptr_aarch64(TCGContext_conflict1 *tcg_ctx,_Bool is_f16)

{
  TCGv_ptr r;
  int local_24;
  int offset;
  TCGv_ptr statusptr;
  _Bool is_f16_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  r = tcg_temp_new_ptr(tcg_ctx);
  if (is_f16) {
    local_24 = 0x2ed0;
  }
  else {
    local_24 = 0x2ec8;
  }
  tcg_gen_addi_ptr(tcg_ctx,r,tcg_ctx->cpu_env,(long)local_24);
  return r;
}

Assistant:

static TCGv_ptr get_fpstatus_ptr(TCGContext *tcg_ctx, int neon)
{
    TCGv_ptr statusptr = tcg_temp_new_ptr(tcg_ctx);
    int offset;
    if (neon) {
        offset = offsetof(CPUARMState, vfp.standard_fp_status);
    } else {
        offset = offsetof(CPUARMState, vfp.fp_status);
    }
    tcg_gen_addi_ptr(tcg_ctx, statusptr, tcg_ctx->cpu_env, offset);
    return statusptr;
}